

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThan,false,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t iVar10;
  long lVar11;
  long lVar12;
  sel_t sVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong local_78;
  
  if (count + 0x3f < 0x40) {
    iVar10 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar10 = 0;
    lVar15 = 0;
    local_78 = 0;
    uVar19 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar17 = uVar19 + 0x40;
        if (count <= uVar19 + 0x40) {
          uVar17 = count;
        }
LAB_0042df30:
        uVar14 = uVar19;
        if (uVar19 < uVar17) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar8 = uVar19 << 4 | 8;
          do {
            uVar14 = uVar19;
            if (psVar2 != (sel_t *)0x0) {
              uVar14 = (ulong)psVar2[uVar19];
            }
            lVar5 = *(long *)((long)&ldata->months + uVar8);
            lVar16 = (long)*(int *)((long)ldata + (uVar8 - 4)) + lVar5 / 86400000000;
            lVar11 = (long)*(int *)((long)ldata + (uVar8 - 8)) + lVar16 / 0x1e;
            lVar6 = *(long *)((long)&rdata->months + uVar8);
            lVar12 = (long)*(int *)((long)rdata + (uVar8 - 4)) + lVar6 / 86400000000;
            lVar20 = (long)*(int *)((long)rdata + (uVar8 - 8)) + lVar12 / 0x1e;
            bVar7 = true;
            if (lVar11 <= lVar20) {
              if (lVar11 < lVar20) {
                bVar7 = false;
              }
              else {
                lVar16 = lVar16 % 0x1e;
                lVar12 = lVar12 % 0x1e;
                bVar7 = true;
                if (lVar16 <= lVar12) {
                  bVar7 = lVar6 % 86400000000 < lVar5 % 86400000000 && lVar12 <= lVar16;
                }
              }
            }
            psVar3[iVar10] = (sel_t)uVar14;
            iVar10 = iVar10 + bVar7;
            psVar4[lVar15] = (sel_t)uVar14;
            lVar15 = (ulong)(bVar7 ^ 1) + lVar15;
            uVar19 = uVar19 + 1;
            uVar8 = uVar8 + 0x10;
            uVar14 = uVar17;
          } while (uVar17 != uVar19);
        }
      }
      else {
        uVar8 = puVar1[local_78];
        uVar17 = uVar19 + 0x40;
        if (count <= uVar19 + 0x40) {
          uVar17 = count;
        }
        if (uVar8 == 0xffffffffffffffff) goto LAB_0042df30;
        uVar14 = uVar17;
        if (uVar8 == 0) {
          if (uVar19 < uVar17) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              sVar13 = (sel_t)uVar19;
              if (psVar2 != (sel_t *)0x0) {
                sVar13 = psVar2[uVar19];
              }
              psVar3[lVar15] = sVar13;
              lVar15 = lVar15 + 1;
              uVar19 = uVar19 + 1;
            } while (uVar17 != uVar19);
          }
        }
        else {
          uVar14 = uVar19;
          if (uVar19 < uVar17) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            psVar4 = false_sel->sel_vector;
            uVar9 = uVar19 << 4 | 8;
            uVar18 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar13 = (int)uVar19 + (int)uVar18;
              }
              else {
                sVar13 = psVar2[uVar19 + uVar18];
              }
              if ((uVar8 >> (uVar18 & 0x3f) & 1) == 0) {
                bVar7 = false;
              }
              else {
                lVar5 = *(long *)((long)&ldata->months + uVar9);
                lVar20 = (long)*(int *)((long)ldata + (uVar9 - 4)) + lVar5 / 86400000000;
                lVar16 = (long)*(int *)((long)ldata + (uVar9 - 8)) + lVar20 / 0x1e;
                lVar6 = *(long *)((long)&rdata->months + uVar9);
                lVar12 = (long)*(int *)((long)rdata + (uVar9 - 4)) + lVar6 / 86400000000;
                lVar11 = (long)*(int *)((long)rdata + (uVar9 - 8)) + lVar12 / 0x1e;
                bVar7 = true;
                if (lVar16 <= lVar11) {
                  if (lVar16 < lVar11) {
                    bVar7 = false;
                  }
                  else {
                    lVar20 = lVar20 % 0x1e;
                    lVar12 = lVar12 % 0x1e;
                    bVar7 = true;
                    if (lVar20 <= lVar12) {
                      bVar7 = lVar6 % 86400000000 < lVar5 % 86400000000 && lVar12 <= lVar20;
                    }
                  }
                }
              }
              psVar3[iVar10] = sVar13;
              iVar10 = iVar10 + bVar7;
              psVar4[lVar15] = sVar13;
              lVar15 = (ulong)(bVar7 ^ 1) + lVar15;
              uVar18 = uVar18 + 1;
              uVar9 = uVar9 + 0x10;
              uVar14 = uVar17;
            } while (uVar17 - uVar19 != uVar18);
          }
        }
      }
      local_78 = local_78 + 1;
      uVar19 = uVar14;
    } while (local_78 != count + 0x3f >> 6);
  }
  return iVar10;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}